

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_column_extra_properties.h
# Opt level: O2

Field_element __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false,_true>_>_>
::get_pivot_value(Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false,_true>_>_>
                  *this)

{
  ID_index IVar1;
  Field_element FVar2;
  node_ptr plVar3;
  
  IVar1 = (this->super_Chain_column_option).pivot_;
  FVar2 = 0;
  if (IVar1 != 0xffffffff) {
    plVar3 = (node_ptr)&this->column_;
    do {
      plVar3 = (((type *)&plVar3->next_)->data_).root_plus_size_.m_header.super_node.next_;
      if (plVar3 == (node_ptr)&this->column_) {
        return 0;
      }
    } while (*(ID_index *)&plVar3[1].next_ != IVar1);
    FVar2 = *(Field_element *)((long)&plVar3[-1].prev_ + 4);
  }
  return FVar2;
}

Assistant:

ID_index get_pivot() const { return pivot_; }